

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O2

void __thiscall nite::Renderable::~Renderable(Renderable *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  Program *this_00;
  int i;
  ulong uVar3;
  
  this->_vptr_Renderable = (_func_int **)&PTR__Renderable_00292780;
  uVar3 = 0;
  while( true ) {
    ppPVar1 = (this->programs).super__Vector_base<nite::Program_*,_std::allocator<nite::Program_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppPVar2 = (this->programs).super__Vector_base<nite::Program_*,_std::allocator<nite::Program_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppPVar2 - (long)ppPVar1 >> 3) <= uVar3) break;
    this_00 = ppPVar1[uVar3];
    if (this_00 != (Program *)0x0) {
      Program::~Program(this_00);
    }
    operator_delete(this_00);
    uVar3 = uVar3 + 1;
  }
  if (ppPVar2 != ppPVar1) {
    (this->programs).super__Vector_base<nite::Program_*,_std::allocator<nite::Program_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar1;
  }
  std::_Vector_base<nite::Program_*,_std::allocator<nite::Program_*>_>::~_Vector_base
            (&(this->programs).super__Vector_base<nite::Program_*,_std::allocator<nite::Program_*>_>
            );
  return;
}

Assistant:

nite::Renderable::~Renderable(){
	for(int i = 0; i < programs.size(); ++i){
		//programs[i]->~Program();
		delete programs[i];
	}
	programs.clear();
}